

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fct_ts__teardown_end(fct_ts_t *ts)

{
  int iVar1;
  fct_ts_t *ts_local;
  
  if (ts->mode != ts_mode_abort) {
    iVar1 = fct_ts__is_more_tests(ts);
    if (iVar1 == 0) {
      ts->mode = ts_mode_ending;
    }
    else {
      ts->mode = ts_mode_setup;
    }
  }
  return;
}

Assistant:

static void
fct_ts__teardown_end(fct_ts_t *ts)
{
    if ( ts->mode == ts_mode_abort )
    {
        return; /* Because we are aborting . */
    }
    /* We have to decide if we should keep on testing by moving into tear down
    mode or if we have reached the real end and should be moving into the
    ending mode. */
    if ( fct_ts__is_more_tests(ts) )
    {
        ts->mode = ts_mode_setup;
    }
    else
    {
        ts->mode = ts_mode_ending;
    }
}